

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditPrivate::connectCompleter(QLineEditPrivate *this)

{
  void **ppvVar1;
  Data *pDVar2;
  undefined4 *puVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QObject local_68 [8];
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  pDVar2 = (this->control->m_completer).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->control->m_completer).wp.value;
  }
  local_58 = QLineEdit::setText;
  pQVar5 = (QObject *)0x0;
  local_50 = (ImplFn)0x0;
  local_48 = QCompleter::activated;
  local_40 = 0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<void_(QLineEdit::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QLineEdit::setText;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar4,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pDVar2 = (this->control->m_completer).wp.d;
  if (pDVar2 != (Data *)0x0) {
    if (*(int *)(pDVar2 + 4) == 0) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->control->m_completer).wp.value;
    }
  }
  local_48 = QCompleter::highlighted;
  local_40 = 0;
  local_58 = completionHighlighted;
  local_50 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QLineEditPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = completionHighlighted;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar5,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::connectCompleter()
{
    Q_Q(const QLineEdit);
    QObject::connect(control->completer(), qOverload<const QString &>(&QCompleter::activated),
                     q, &QLineEdit::setText);
    QObjectPrivate::connect(control->completer(), qOverload<const QString &>(&QCompleter::highlighted),
                            this, &QLineEditPrivate::completionHighlighted);
}